

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall google::protobuf::RepeatedField<float>::~RepeatedField(RepeatedField<float> *this)

{
  ulong uVar1;
  int iVar2;
  ThreadSafeArena *this_00;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  this_00 = &GetArena(this,(uVar1 & 4) == 0)->impl_;
  if (this_00 != (ThreadSafeArena *)0x0) {
    internal::ThreadSafeArena::SpaceAllocated(this_00);
  }
  iVar2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  if (((uVar1 & 4) != 0) && (0 < iVar2)) {
    internal::LongSooRep::elements((LongSooRep *)this);
  }
  UnpoisonBuffer(this);
  if ((uVar1 & 4) != 0) {
    InternalDeallocate<true>(this);
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
  StaticValidityCheck();
  const bool is_soo = this->is_soo();
#ifndef NDEBUG
  // Try to trigger segfault / asan failure in non-opt builds if arena_
  // lifetime has ended before the destructor.
  auto arena = GetArena(is_soo);
  if (arena) (void)arena->SpaceAllocated();
#endif
  const int size = this->size(is_soo);
  if (size > 0) {
    Element* elem = unsafe_elements(is_soo);
    Destroy(elem, elem + size);
  }
  UnpoisonBuffer();
  if (!is_soo) InternalDeallocate<true>();
}